

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyTable.c
# Opt level: O2

void Ivy_TableInsert(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  Ivy_Obj_t *pObj_00;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  char *__assertion;
  ulong uVar9;
  timespec local_40;
  
  if (((ulong)pObj & 1) != 0) {
    __assertion = "!Ivy_IsComplement(pObj)";
    uVar1 = 0x6c;
LAB_0064e8f8:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyTable.c"
                  ,uVar1,"void Ivy_TableInsert(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if (0xfffffffc < (*(uint *)&pObj->field_0x8 & 0xf) - 7) {
    if (((pObj->Id & 0x3f) == 0) && (p->nTableSize < (p->nObjs[6] + p->nObjs[5] + p->nObjs[4]) * 2))
    {
      clock_gettime(3,&local_40);
      piVar4 = p->pTable;
      uVar1 = p->nTableSize;
      uVar5 = (p->nObjs[6] + p->nObjs[5] + p->nObjs[4]) * 5 - 1;
LAB_0064e804:
      do {
        uVar6 = uVar5 + 1;
        uVar2 = uVar5 & 1;
        uVar5 = uVar6;
      } while (uVar2 != 0);
      uVar8 = 3;
LAB_0064e80f:
      iVar7 = (int)uVar8;
      if ((uint)(iVar7 * iVar7) <= uVar6) goto code_r0x0064e818;
      p->nTableSize = uVar6;
      piVar3 = (int *)calloc(1,(long)(int)uVar6 << 2);
      p->pTable = piVar3;
      uVar9 = 0;
      uVar8 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar8 = uVar9;
      }
      for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
        if (piVar4[uVar9] != 0) {
          pObj_00 = Ivy_ManObj(p,piVar4[uVar9]);
          piVar3 = Ivy_TableFind(p,pObj_00);
          if (*piVar3 != 0) {
            __assert_fail("*pPlace == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyTable.c"
                          ,0xe4,"void Ivy_TableResize(Ivy_Man_t *)");
          }
          *piVar3 = piVar4[uVar9];
        }
      }
      free(piVar4);
    }
    piVar4 = Ivy_TableFind(p,pObj);
    if (*piVar4 != 0) {
      __assertion = "*pPlace == 0";
      uVar1 = 0x75;
      goto LAB_0064e8f8;
    }
    *piVar4 = pObj->Id;
  }
  return;
code_r0x0064e818:
  uVar9 = (ulong)uVar6 % uVar8;
  uVar8 = (ulong)(iVar7 + 2);
  if ((int)uVar9 == 0) goto LAB_0064e804;
  goto LAB_0064e80f;
}

Assistant:

void Ivy_TableInsert( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    int * pPlace;
    assert( !Ivy_IsComplement(pObj) );
    if ( !Ivy_ObjIsHash(pObj) )
        return;
    if ( (pObj->Id & 63) == 0 )
    {
        if ( p->nTableSize < 2 * Ivy_ManHashObjNum(p) )
            Ivy_TableResize( p );
    }
    pPlace = Ivy_TableFind( p, pObj );
    assert( *pPlace == 0 );
    *pPlace = pObj->Id;
}